

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall duckdb_re2::Compiler::Match(Compiler *this,int32_t match_id)

{
  Frag FVar1;
  uint local_38;
  uint uStack_2c;
  
  local_38 = AllocInst(this,1);
  if ((int)local_38 < 0) {
    local_38 = 0;
  }
  else {
    Prog::Inst::InitMatch
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + local_38,
               match_id);
  }
  uStack_2c = uStack_2c & 0xffffff00;
  FVar1.end.head = 0;
  FVar1.end.tail = 0;
  FVar1.begin = local_38;
  FVar1._12_4_ = uStack_2c;
  return FVar1;
}

Assistant:

Frag Compiler::Match(int32_t match_id) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitMatch(match_id);
  return Frag(id, kNullPatchList, false);
}